

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int ffi_callback_set(lua_State *L,GCfunc *fn)

{
  CTState *cts_00;
  GCtab *t_00;
  uint64_t uVar1;
  GCcdata *pGVar2;
  MSize local_14c;
  TValue *local_148;
  TValue *tv;
  GCtab *t;
  MSize slot;
  CType *ct;
  CTState *cts;
  GCcdata *cd;
  GCfunc *fn_local;
  lua_State *L_local;
  CTState *cts_1;
  CType *local_f0;
  CType *ct_1;
  GCobj *o;
  
  pGVar2 = ffi_checkcdata(L,1);
  cts_00 = *(CTState **)((L->glref).ptr64 + 0x180);
  cts_00->L = L;
  for (local_f0 = cts_00->tab + pGVar2->ctypeid; local_f0->info >> 0x1c == 8;
      local_f0 = cts_00->tab + (local_f0->info & 0xffff)) {
  }
  if ((((local_f0->info >> 0x1c == 2) && (local_f0->size == 8)) &&
      (local_14c = lj_ccallback_ptr2slot(cts_00,(void *)pGVar2[1].nextgc.gcptr64),
      local_14c < (cts_00->cb).sizeid)) && ((cts_00->cb).cbid[local_14c] != 0)) {
    t_00 = cts_00->miscmap;
    if (local_14c < t_00->asize) {
      local_148 = (TValue *)((t_00->array).ptr64 + (long)(int)local_14c * 8);
    }
    else {
      local_148 = lj_tab_setinth(L,t_00,local_14c);
    }
    if (fn == (GCfunc *)0x0) {
      local_148->u64 = 0xffffffffffffffff;
      (cts_00->cb).cbid[local_14c] = 0;
      if ((cts_00->cb).topid <= local_14c) {
        local_14c = (cts_00->cb).topid;
      }
      (cts_00->cb).topid = local_14c;
    }
    else {
      local_148->u64 = (ulong)fn | 0xfffb800000000000;
      if ((t_00->marked & 4) != 0) {
        uVar1 = (L->glref).ptr64;
        t_00->marked = t_00->marked & 0xfb;
        (t_00->gclist).gcptr64 = *(uint64_t *)(uVar1 + 0x40);
        *(GCtab **)(uVar1 + 0x40) = t_00;
      }
    }
    return 0;
  }
  lj_err_caller(L,LJ_ERR_FFI_BADCBACK);
}

Assistant:

static int ffi_callback_set(lua_State *L, GCfunc *fn)
{
  GCcdata *cd = ffi_checkcdata(L, 1);
  CTState *cts = ctype_cts(L);
  CType *ct = ctype_raw(cts, cd->ctypeid);
  if (ctype_isptr(ct->info) && (LJ_32 || ct->size == 8)) {
    MSize slot = lj_ccallback_ptr2slot(cts, *(void **)cdataptr(cd));
    if (slot < cts->cb.sizeid && cts->cb.cbid[slot] != 0) {
      GCtab *t = cts->miscmap;
      TValue *tv = lj_tab_setint(L, t, (int32_t)slot);
      if (fn) {
	setfuncV(L, tv, fn);
	lj_gc_anybarriert(L, t);
      } else {
	setnilV(tv);
	cts->cb.cbid[slot] = 0;
	cts->cb.topid = slot < cts->cb.topid ? slot : cts->cb.topid;
      }
      return 0;
    }
  }
  lj_err_caller(L, LJ_ERR_FFI_BADCBACK);
  return 0;
}